

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O3

bool basisu::unpack_pvrtc2(void *p,color_rgba *pPixels)

{
  uint uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  byte bVar10;
  uint uVar11;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar12;
  uint uVar13;
  uint32_t i;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar25 [16];
  color_rgba color_b;
  color_rgba color_a;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_48;
  undefined8 local_44;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_3c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_38;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_34;
  
  uVar1 = *(uint *)((long)p + 4);
  if ((uVar1 & 0x8001) == 0x8000) {
    if ((int)uVar1 < 0) {
      uVar11 = uVar1 >> 1 & 0xf;
      uVar22 = uVar1 >> 0xc & 7 | uVar1 >> 7 & 0xf8;
      uVar14 = uVar1 >> 7 & 7 | uVar1 >> 2 & 0xf8;
      uVar13 = uVar11 >> 1 | uVar1 >> 1 & 8 | uVar11 << 4;
      local_48 = (anon_union_4_2_6eba8969_for_color_rgba_0)
                 ((uVar14 << 8 | uVar13 << 0x10 | uVar22) - 0x1000000);
      uVar11 = uVar1 >> 0x1c & 7 | uVar1 >> 0x17 & 0xf8;
      uVar17 = uVar1 >> 0x17 & 7 | uVar1 >> 0x12 & 0xf8;
      uVar18 = uVar1 >> 0x12 & 7 | uVar1 >> 0xd & 0xf8;
      local_3c = (anon_union_4_2_6eba8969_for_color_rgba_0)
                 (uVar17 << 8 | uVar18 << 0x10 | uVar11 | 0xff000000);
      uVar16 = uVar11 * 3 + uVar22 * 5;
      uVar21 = uVar17 * 3 + uVar14 * 5;
      uVar19 = 0xff;
      uVar20 = 0xff;
    }
    else {
      uVar11 = uVar1 >> 8 & 0xf;
      local_34.m_comps[0] = (char)(uVar11 >> 3) + (char)uVar11 * '\x02';
      uVar11 = uVar1 >> 4 & 0xf;
      local_34.m_comps[1] = (char)(uVar11 >> 3) + (char)uVar11 * '\x02';
      uVar11 = uVar1 >> 1 & 7;
      local_34.m_comps[2] = (char)(uVar11 >> 1) + (char)uVar11 * '\x04';
      local_34.m_comps[3] = (byte)(uVar1 >> 0xb) & 0xe;
      uVar11 = uVar1 >> 0x18 & 0xf;
      local_38.m_comps[0] = (char)(uVar11 >> 3) + (char)uVar11 * '\x02';
      uVar11 = uVar1 >> 0x14 & 0xf;
      local_38.m_comps[1] = (char)(uVar11 >> 3) + (char)uVar11 * '\x02';
      uVar11 = uVar1 >> 0x10 & 0xf;
      local_38.m_comps[2] = (char)(uVar11 >> 3) + (char)uVar11 * '\x02';
      local_38.m_comps[3] = (byte)(uVar1 >> 0x1b) | 1;
      aVar12.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgba_5554_to_8888((color_rgba *)&local_34.field_1);
      local_48.field_1 = aVar12.field_1;
      local_3c.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgba_5554_to_8888((color_rgba *)&local_38.field_1);
      uVar20 = (uint)aVar12 >> 0x18;
      uVar19 = (uint)local_3c >> 0x18;
      uVar22 = (uint)aVar12 & 0xff;
      uVar11 = (uint)local_3c & 0xff;
      uVar16 = uVar11 * 3 + uVar22 * 5;
      uVar14 = (uint)aVar12 >> 8 & 0xff;
      uVar17 = (uint)local_3c >> 8 & 0xff;
      uVar21 = uVar17 * 3 + uVar14 * 5;
      uVar13 = (uint)aVar12 >> 0x10 & 0xff;
      uVar18 = (uint)local_3c >> 0x10 & 0xff;
    }
    auVar24._0_4_ = uVar11 * 5 + uVar22 * 3 >> 3;
    auVar24._4_4_ = uVar17 * 5 + uVar14 * 3 >> 3;
    auVar24._8_4_ = uVar18 * 5 + uVar13 * 3 >> 3;
    auVar24._12_4_ = uVar19 * 5 + uVar20 * 3 >> 3;
    auVar23._0_4_ = uVar16 >> 3;
    auVar23._4_4_ = uVar21 >> 3;
    auVar23._8_4_ = uVar18 * 3 + uVar13 * 5 >> 3;
    auVar23._12_4_ = uVar19 * 3 + uVar20 * 5 >> 3;
    auVar25 = pmovzxbd(in_XMM2,0xffffffff);
    auVar23 = packusdw(auVar23 & auVar25,auVar24 & auVar25);
    sVar2 = auVar23._0_2_;
    sVar3 = auVar23._2_2_;
    sVar4 = auVar23._4_2_;
    sVar5 = auVar23._6_2_;
    sVar6 = auVar23._8_2_;
    sVar7 = auVar23._10_2_;
    sVar8 = auVar23._12_2_;
    sVar9 = auVar23._14_2_;
    local_44 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar23[0xe] - (0xff < sVar9),
                        CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar23[0xc] - (0xff < sVar8),
                                 CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar23[10] -
                                          (0xff < sVar7),
                                          CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar23[8] -
                                                   (0xff < sVar6),
                                                   CONCAT13((0 < sVar5) * (sVar5 < 0x100) *
                                                            auVar23[6] - (0xff < sVar5),
                                                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                     auVar23[4] - (0xff < sVar4),
                                                                     CONCAT11((0 < sVar3) *
                                                                              (sVar3 < 0x100) *
                                                                              auVar23[2] -
                                                                              (0xff < sVar3),
                                                                              (0 < sVar2) *
                                                                              (sVar2 < 0x100) *
                                                                              auVar23[0] -
                                                                              (0xff < sVar2))))))));
    bVar10 = 0;
    uVar15 = 0;
    do {
      pPixels[uVar15].field_0 =
           (&local_48)[*(byte *)((long)p + (uVar15 >> 2 & 0x3fffffff)) >> (bVar10 & 6) & 3];
      uVar15 = uVar15 + 1;
      bVar10 = bVar10 + 2;
    } while (uVar15 != 0x10);
  }
  return (uVar1 & 0x8001) == 0x8000;
}

Assistant:

bool unpack_pvrtc2(const void *p, color_rgba *pPixels)
	{
		const pvrtc2_block* pBlock = static_cast<const pvrtc2_block*>(p);

		if ((!pBlock->m_opaque_color_data.m_hard_flag) || (pBlock->m_opaque_color_data.m_mod_flag))
		{
			// This mode isn't supported by the transcoder, so we aren't bothering with it here.
			return false;
		}

		color_rgba colors[4];

		if (pBlock->m_opaque_color_data.m_opaque_flag)
		{
			// colora=554
			color_rgba color_a(pBlock->m_opaque_color_data.m_red_a, pBlock->m_opaque_color_data.m_green_a, (pBlock->m_opaque_color_data.m_blue_a << 1) | (pBlock->m_opaque_color_data.m_blue_a >> 3), 255);
			
			// colora=555
			color_rgba color_b(pBlock->m_opaque_color_data.m_red_b, pBlock->m_opaque_color_data.m_green_b, pBlock->m_opaque_color_data.m_blue_b, 255);
						
			colors[0] = convert_rgb_555_to_888(color_a);
			colors[3] = convert_rgb_555_to_888(color_b);

			colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, 255);
			colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, 255);
		}
		else
		{
			// colora=4433 
			color_rgba color_a(
				(pBlock->m_trans_color_data.m_red_a << 1) | (pBlock->m_trans_color_data.m_red_a >> 3), 
				(pBlock->m_trans_color_data.m_green_a << 1) | (pBlock->m_trans_color_data.m_green_a >> 3),
				(pBlock->m_trans_color_data.m_blue_a << 2) | (pBlock->m_trans_color_data.m_blue_a >> 1), 
				pBlock->m_trans_color_data.m_alpha_a << 1);

			//colorb=4443
			color_rgba color_b(
				(pBlock->m_trans_color_data.m_red_b << 1) | (pBlock->m_trans_color_data.m_red_b >> 3),
				(pBlock->m_trans_color_data.m_green_b << 1) | (pBlock->m_trans_color_data.m_green_b >> 3),
				(pBlock->m_trans_color_data.m_blue_b << 1) | (pBlock->m_trans_color_data.m_blue_b >> 3),
				(pBlock->m_trans_color_data.m_alpha_b << 1) | 1);

			colors[0] = convert_rgba_5554_to_8888(color_a);
			colors[3] = convert_rgba_5554_to_8888(color_b);
		}

		colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, (colors[0].a * 5 + colors[3].a * 3) / 8);
		colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, (colors[0].a * 3 + colors[3].a * 5) / 8);

		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t sel = (pBlock->m_modulation[i >> 2] >> ((i & 3) * 2)) & 3;
			pPixels[i] = colors[sel];
		}

		return true;
	}